

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::CheckCaps(HMISong *this,int tech)

{
  int iVar1;
  TrackInfo *pTVar2;
  WORD WVar3;
  WORD WVar4;
  bool bVar5;
  WORD *pWVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  WVar4 = 0xa008;
  if (tech == 1) {
    WVar4 = 0xa001;
  }
  WVar3 = 0xa009;
  if (tech != 4) {
    WVar3 = WVar4;
  }
  iVar1 = this->NumTracks;
  if (0 < (long)iVar1) {
    pTVar2 = this->Tracks;
    pWVar6 = pTVar2->Designation;
    lVar7 = 0;
    do {
      pTVar2[lVar7].Enabled = false;
      bVar5 = false;
      uVar8 = 0;
      while (WVar4 = pWVar6[uVar8], WVar4 != 0) {
        if (WVar3 == WVar4) {
          pTVar2[lVar7].Enabled = true;
          break;
        }
        bVar9 = tech != 4;
        if ((WVar4 == 0xa000) || (bVar9 = tech == 4, WVar4 == 0xa002)) {
          pTVar2[lVar7].Enabled = bVar9;
          bVar5 = bVar9;
        }
        if ((6 < uVar8) || (uVar8 = uVar8 + 1, bVar5 != false)) break;
      }
      lVar7 = lVar7 + 1;
      pWVar6 = pWVar6 + 0x1c;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void HMISong::CheckCaps(int tech)
{
	// What's the equivalent HMI device for our technology?
	if (tech == MOD_FMSYNTH)
	{
		tech = HMI_DEV_OPL3;
	}
	else if (tech == MOD_MIDIPORT)
	{
		tech = HMI_DEV_MPU401;
	}
	else
	{ // Good enough? Or should we just say we're GM.
		tech = HMI_DEV_SBAWE32;
	}

	for (int i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Enabled = false;
		// Track designations are stored in a 0-terminated array.
		for (unsigned int j = 0; j < countof(Tracks[i].Designation) && Tracks[i].Designation[j] != 0; ++j)
		{
			if (Tracks[i].Designation[j] == tech)
			{
				Tracks[i].Enabled = true;
			}
			// If a track is designated for device 0xA000, it will be played by a MIDI
			// driver for device types 0xA000, 0xA001, and 0xA008. Why this does not
			// include the GUS, I do not know.
			else if (Tracks[i].Designation[j] == HMI_DEV_GM)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_MPU401 || tech == HMI_DEV_SBAWE32);
			}
			// If a track is designated for device 0xA002, it will be played by a MIDI
			// driver for device types 0xA002 or 0xA009.
			else if (Tracks[i].Designation[j] == HMI_DEV_OPL2)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_OPL3);
			}
			// Any other designation must match the specific MIDI driver device number.
			// (Which we handled first above.)

			if (Tracks[i].Enabled)
			{ // This track's been enabled, so we can stop checking other designations.
				break;
			}
		}
	}
}